

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

float * __thiscall
TPZSparseBlockDiagonal<float>::s(TPZSparseBlockDiagonal<float> *this,int64_t row,int64_t col)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  TPZSparseBlockDiagonal<float> *in_RDX;
  long in_RDI;
  int64_t pos;
  int64_t cblockindex;
  int64_t cblock;
  int64_t rblockindex;
  int64_t rblock;
  long local_40;
  int64_t *in_stack_ffffffffffffffc8;
  int64_t *in_stack_ffffffffffffffd0;
  int64_t *in_stack_ffffffffffffffd8;
  float *local_8;
  
  FindBlockIndex(in_RDX,(int64_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
  if (in_stack_ffffffffffffffd8 == (int64_t *)0xffffffffffffffff) {
    local_8 = &TPZMatrix<float>::gZero;
  }
  else {
    FindBlockIndex(in_RDX,(int64_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffc8);
    if (in_stack_ffffffffffffffc8 == in_stack_ffffffffffffffd8) {
      piVar2 = TPZVec<int>::operator[]
                         ((TPZVec<int> *)(in_RDI + 0x60),(int64_t)in_stack_ffffffffffffffd8);
      iVar1 = *piVar2;
      plVar3 = TPZVec<long>::operator[]
                         ((TPZVec<long> *)(in_RDI + 0x40),(int64_t)in_stack_ffffffffffffffd8);
      local_8 = TPZVec<float>::operator[]
                          ((TPZVec<float> *)(in_RDI + 0x20),
                           (long)in_stack_ffffffffffffffd0 + *plVar3 + local_40 * iVar1);
    }
    else {
      local_8 = &TPZMatrix<float>::gZero;
    }
  }
  return local_8;
}

Assistant:

TVar& TPZSparseBlockDiagonal<TVar>::s(const int64_t row, const int64_t col)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return this->gZero;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return this->gZero;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	return this->fStorage[this->fBlockPos[rblock]+pos];
}